

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.cpp
# Opt level: O0

void __thiscall
ORPG::Core::XMLElement::add_attribute(XMLElement *this,string *name,string *value,int line)

{
  bool bVar1;
  XMLAttribute *pXVar2;
  string local_110;
  undefined1 local_e9;
  string local_e8;
  string local_c8;
  string local_a8;
  XMLAttribute *local_88;
  XMLAttribute *curr;
  string local_78;
  string local_48;
  int local_24;
  string *psStack_20;
  int line_local;
  string *value_local;
  string *name_local;
  XMLElement *this_local;
  
  local_24 = line;
  psStack_20 = value;
  value_local = name;
  name_local = (string *)this;
  if (this->root == (XMLAttribute *)0x0) {
    pXVar2 = (XMLAttribute *)operator_new(0x50);
    curr._7_1_ = 1;
    std::__cxx11::string::string((string *)&local_48,(string *)name);
    std::__cxx11::string::string((string *)&local_78,(string *)value);
    XMLAttribute::XMLAttribute(pXVar2,&local_48,&local_78,local_24);
    curr._7_1_ = 0;
    this->root = pXVar2;
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_48);
  }
  else {
    for (local_88 = this->root; local_88 != (XMLAttribute *)0x0;
        local_88 = XMLAttribute::get_next(local_88)) {
      XMLAttribute::get_name_abi_cxx11_(&local_a8,local_88);
      bVar1 = std::operator!=(&local_a8,name);
      std::__cxx11::string::~string((string *)&local_a8);
      pXVar2 = local_88;
      if (!bVar1) {
        std::__cxx11::string::string((string *)&local_110,(string *)value);
        XMLAttribute::set_value(pXVar2,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        return;
      }
      pXVar2 = XMLAttribute::get_next(local_88);
      if (pXVar2 == (XMLAttribute *)0x0) {
        pXVar2 = (XMLAttribute *)operator_new(0x50);
        local_e9 = 1;
        std::__cxx11::string::string((string *)&local_c8,(string *)name);
        std::__cxx11::string::string((string *)&local_e8,(string *)value);
        XMLAttribute::XMLAttribute(pXVar2,&local_c8,&local_e8,local_24);
        local_e9 = 0;
        local_88->next = pXVar2;
        std::__cxx11::string::~string((string *)&local_e8);
        std::__cxx11::string::~string((string *)&local_c8);
        return;
      }
    }
  }
  return;
}

Assistant:

void XMLElement::add_attribute(std::string name, std::string value, int line) {
    if(root == nullptr) {
        root = new XMLAttribute(name, value, line);
    } else {
        XMLAttribute* curr = root;
        while(curr != nullptr) {
            if(curr->get_name() != name) {
                // we made it to the end of the attribute list and did not find
                // a match, so lets add it to the list
                if(curr->get_next() == nullptr) {
                    curr->next = new XMLAttribute(name, value, line);
                    break;
                }

                curr = curr->get_next();
            } else {
                // found it
                //TODO(incomingstick): update line number?
                curr->set_value(value);
                break;
            }
        }
    }
}